

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_range.c
# Opt level: O3

CURLcode Curl_range(connectdata *conn)

{
  Curl_easy *pCVar1;
  char *str;
  byte bVar2;
  CURLofft CVar3;
  int iVar4;
  CURLofft CVar5;
  long lVar6;
  long lVar7;
  char *ptr;
  curl_off_t to;
  curl_off_t from;
  char *ptr2;
  byte *local_38;
  long local_30;
  long local_28;
  char *local_20;
  
  pCVar1 = conn->data;
  lVar7 = 0xf8;
  lVar6 = -1;
  if ((((pCVar1->state).field_0x4e5 & 2) != 0) && (str = (pCVar1->state).range, str != (char *)0x0))
  {
    CVar3 = curlx_strtoofft(str,(char **)&local_38,0,&local_28);
    if (CVar3 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    bVar2 = *local_38;
    while ((bVar2 != 0 && ((iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0 || (*local_38 == 0x2d)))))
    {
      bVar2 = local_38[1];
      local_38 = local_38 + 1;
    }
    CVar5 = curlx_strtoofft((char *)local_38,&local_20,0,&local_30);
    if (CVar5 == CURL_OFFT_FLOW) {
      return CURLE_RANGE_ERROR;
    }
    if (CVar5 == CURL_OFFT_INVAL && CVar3 == CURL_OFFT_OK) {
      lVar7 = 0x14d8;
      lVar6 = local_28;
    }
    else {
      if (CVar3 == CURL_OFFT_INVAL && CVar5 == CURL_OFFT_OK) {
        (pCVar1->req).maxdownload = local_30;
        local_28 = -local_30;
      }
      else {
        if (local_30 < local_28) {
          return CURLE_RANGE_ERROR;
        }
        if (local_30 - local_28 == 0x7fffffffffffffff) {
          return CURLE_RANGE_ERROR;
        }
        (pCVar1->req).maxdownload = (local_30 - local_28) + 1;
      }
      lVar7 = 0x14d8;
      lVar6 = local_28;
    }
  }
  *(long *)((long)&pCVar1->next + lVar7) = lVar6;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_range(struct connectdata *conn)
{
  curl_off_t from, to;
  char *ptr;
  char *ptr2;
  struct Curl_easy *data = conn->data;

  if(data->state.use_range && data->state.range) {
    CURLofft from_t;
    CURLofft to_t;
    from_t = curlx_strtoofft(data->state.range, &ptr, 0, &from);
    if(from_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    while(*ptr && (ISSPACE(*ptr) || (*ptr == '-')))
      ptr++;
    to_t = curlx_strtoofft(ptr, &ptr2, 0, &to);
    if(to_t == CURL_OFFT_FLOW)
      return CURLE_RANGE_ERROR;
    if((to_t == CURL_OFFT_INVAL) && !from_t) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" CURL_FORMAT_CURL_OFF_T " to end of file\n",
                   from));
    }
    else if((from_t == CURL_OFFT_INVAL) && !to_t) {
      /* -Y */
      data->req.maxdownload = to;
      data->state.resume_from = -to;
      DEBUGF(infof(data, "RANGE the last %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   to));
    }
    else {
      /* X-Y */
      curl_off_t totalsize;

      /* Ensure the range is sensible - to should follow from. */
      if(from > to)
        return CURLE_RANGE_ERROR;

      totalsize = to - from;
      if(totalsize == CURL_OFF_T_MAX)
        return CURLE_RANGE_ERROR;

      data->req.maxdownload = totalsize + 1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" CURL_FORMAT_CURL_OFF_T
                   " getting %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" CURL_FORMAT_CURL_OFF_T
                 " to %" CURL_FORMAT_CURL_OFF_T ", totally %"
                 CURL_FORMAT_CURL_OFF_T " bytes\n",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}